

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int moveto_op_math(lyxp_set *set1,lyxp_set *set2,char *op,lyd_node *cur_node,lys_module *param_5,
                  int options)

{
  byte bVar1;
  int iVar2;
  ly_ctx *ctx;
  longdouble lVar3;
  
  if (set2 == (lyxp_set *)0x0) {
    if (*op != '-') {
      __assert_fail("set1 && set2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ,0x1a74,
                    "int moveto_op_math(struct lyxp_set *, struct lyxp_set *, const char *, struct lyd_node *, struct lys_module *, int)"
                   );
    }
    iVar2 = lyxp_set_cast(set1,LYXP_SET_NUMBER,cur_node,param_5,options);
    if (iVar2 == 0) {
      (set1->val).num = -(set1->val).num;
      return 0;
    }
    return -1;
  }
  iVar2 = lyxp_set_cast(set1,LYXP_SET_NUMBER,cur_node,param_5,options);
  if (iVar2 != 0) {
    return -1;
  }
  iVar2 = lyxp_set_cast(set2,LYXP_SET_NUMBER,cur_node,param_5,options);
  if (iVar2 != 0) {
    return -1;
  }
  bVar1 = *op;
  if (bVar1 < 0x2d) {
    if (bVar1 == 0x2a) {
      lVar3 = (set1->val).num * (set2->val).num;
    }
    else {
      if (bVar1 != 0x2b) {
LAB_0017af15:
        if (param_5 == (lys_module *)0x0) {
          ctx = (ly_ctx *)0x0;
        }
        else {
          ctx = param_5->ctx;
        }
        ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
               ,0x1a98);
        return -1;
      }
      lVar3 = (set1->val).num + (set2->val).num;
    }
  }
  else if (bVar1 == 0x2d) {
    lVar3 = (set1->val).num - (set2->val).num;
  }
  else if (bVar1 == 100) {
    lVar3 = (set1->val).num / (set2->val).num;
  }
  else {
    if (bVar1 != 0x6d) goto LAB_0017af15;
    lVar3 = (longdouble)((long)ROUND((set1->val).num) % (long)ROUND((set2->val).num));
  }
  (set1->val).num = lVar3;
  return 0;
}

Assistant:

static int
moveto_op_math(struct lyxp_set *set1, struct lyxp_set *set2, const char *op, struct lyd_node *cur_node,
               struct lys_module *local_mod, int options)
{
    /* unary '-' */
    if (!set2 && (op[0] == '-')) {
        if (lyxp_set_cast(set1, LYXP_SET_NUMBER, cur_node, local_mod, options)) {
            return -1;
        }
        set1->val.num *= -1;
        lyxp_set_free(set2);
        return EXIT_SUCCESS;
    }

    assert(set1 && set2);

    if (lyxp_set_cast(set1, LYXP_SET_NUMBER, cur_node, local_mod, options)) {
        return -1;
    }
    if (lyxp_set_cast(set2, LYXP_SET_NUMBER, cur_node, local_mod, options)) {
        return -1;
    }

    switch (op[0]) {
    /* '+' */
    case '+':
        set1->val.num += set2->val.num;
        break;

    /* '-' */
    case '-':
        set1->val.num -= set2->val.num;
        break;

    /* '*' */
    case '*':
        set1->val.num *= set2->val.num;
        break;

    /* 'div' */
    case 'd':
        set1->val.num /= set2->val.num;
        break;

    /* 'mod' */
    case 'm':
        set1->val.num = ((long long)set1->val.num) % ((long long)set2->val.num);
        break;

    default:
        LOGINT(local_mod ? local_mod->ctx : NULL);
        return -1;
    }

    return EXIT_SUCCESS;
}